

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  long *plVar2;
  SolveResult SVar3;
  ostream *poVar4;
  size_t sVar5;
  SolveResult result;
  Board board;
  allocator local_61;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Board local_40;
  
  if (argc == 2) {
    Board::Board(&local_40);
    std::__cxx11::string::string((string *)local_60,argv[1],&local_61);
    bVar1 = Board::load(&local_40,(string *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_60._4_4_,local_60._0_4_),local_50._M_allocated_capacity + 1)
      ;
    }
    if (bVar1) {
      Board::print(&local_40);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      SolveResult::SolveResult((SolveResult *)local_60);
      bVar1 = Board::isSolveable(&local_40);
      if (bVar1) {
        std::chrono::_V2::steady_clock::now();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solving...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        plVar2 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        SVar3 = Board::solve(&local_40);
        local_60._0_4_ = SVar3.backtracks;
        local_60[4] = SVar3.solved;
        std::chrono::_V2::steady_clock::now();
        if ((bool)local_60[4] == true) {
          Board::print(&local_40);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solved in ",10);
          poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms",3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"with backtracks: ",0x11);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
      }
      if ((bool)local_60[4] == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"is not solveable",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"could not load ",0xf);
      __s = argv[1];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11e1e0);
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"press any key to exit...",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    getchar();
    Board::~Board(&local_40);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc == 2)
	{
		Board board{};

		if (board.load(argv[1]))
		{
			board.print();

			std::cout << std::endl << std::endl;

			SolveResult result{};

			if (board.isSolveable())
			{
				auto begin = std::chrono::steady_clock::now();

				std::cout << "solving..." << std::endl << std::endl;
				result = board.solve();

				auto end = std::chrono::steady_clock::now();

				auto elapsedMilliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count();

				if (result.solved)
				{
					board.print();
					std::cout << std::endl;
					std::cout << "solved in " << elapsedMilliseconds << " ms" << std::endl;
					std::cout << "with backtracks: " << result.backtracks << std::endl;
				}
			}

			if(!result.solved)
			{
				std::cout << "is not solveable" << std::endl;
			}
		}
		else
		{
			std::cout << "could not load " << argv[1] << std::endl;
		}

		std::cout << "press any key to exit..." << std::endl;
		std::getchar();
	}

	return 0;
}